

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::Add(VirtualMachine *this)

{
  element_type *peVar1;
  VariableType VVar2;
  undefined8 uVar3;
  anon_union_8_6_52c89740_for_Variable_1 aVar4;
  Variable VVar5;
  Variable VVar6;
  
  VVar5 = popOpStack(this);
  VVar6 = popOpStack(this);
  VVar2 = VVar6.type;
  if (VVar2 == VVar5.type) {
    if (VVar2 == Float) {
      aVar4.doubleValue = VVar5.field_1.doubleValue + VVar6.field_1.doubleValue;
      uVar3 = 3;
      goto LAB_001159a7;
    }
    if (VVar2 == Integer) {
      aVar4.integerValue =
           (long)&((VVar6.field_1.objectValue)->properties)._M_h._M_buckets +
           VVar5.field_1.integerValue;
      uVar3 = 1;
      goto LAB_001159a7;
    }
  }
  uVar3 = 0;
  aVar4.integerValue = 0;
LAB_001159a7:
  VVar5.field_1.integerValue = aVar4.integerValue;
  VVar5._0_8_ = uVar3;
  pushOpStack(this,VVar5);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Add() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (!this->protectDifferentTypes(first, second)) {
    this->advance();
    return;
  }

  if (first.type == VariableType::Integer) {
    this->pushInteger(first.integerValue + second.integerValue);

  } else if (first.type == VariableType::Float) {
    this->pushFloat(first.doubleValue + second.doubleValue);

  } else {
    this->pushUndefined();
  }

  this->advance();
}